

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepScanLineBasic.cpp
# Opt level: O3

void testDeepScanLineBasic(string *tempDir)

{
  int iVar1;
  char *pcVar2;
  undefined4 *puVar3;
  bool bVar4;
  Header h;
  Header aHStack_88 [64];
  undefined8 local_48 [6];
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n",
             0x3a);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'X');
  std::ostream::put('X');
  std::ostream::flush();
  random_reseed(1);
  IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::numThreads();
  iVar1 = IlmThread_3_2::ThreadPool::globalThreadPool();
  IlmThread_3_2::ThreadPool::setNumThreads(iVar1);
  local_48[0] = 0;
  Imf_3_2::Header::Header
            (aHStack_88,0x40,0x40,1.0,(Vec2 *)local_48,1.0,INCREASING_Y,ZIP_COMPRESSION);
  Imf_3_2::Header::setType((string *)aHStack_88);
  pcVar2 = (char *)Imf_3_2::Header::channels();
  Imf_3_2::Channel::Channel((Channel *)local_48,HALF,1,1,false);
  Imf_3_2::ChannelList::insert(pcVar2,(Channel *)"Dummy");
  puVar3 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar3 = 0;
  bVar4 = SUB81(aHStack_88,0);
  Imf_3_2::Header::sanityCheck(bVar4,false);
  puVar3 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar3 = 2;
  Imf_3_2::Header::sanityCheck(bVar4,false);
  puVar3 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar3 = 1;
  Imf_3_2::Header::sanityCheck(bVar4,false);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"accepted valid compression types\n",0x21);
  puVar3 = (undefined4 *)Imf_3_2::Header::compression();
  *puVar3 = 3;
  Imf_3_2::Header::sanityCheck(bVar4,false);
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/meshula[P]openexr/src/test/OpenEXRTest/testDeepScanLineBasic.cpp"
                ,0x24b,"void (anonymous namespace)::testCompressionTypeChecks()");
}

Assistant:

void
testDeepScanLineBasic (const std::string& tempDir)
{
    try
    {
        cout << "\n\nTesting the DeepScanLineInput/OutputFile for basic use:\n"
             << endl;

        random_reseed (1);

        int numThreads = ThreadPool::globalThreadPool ().numThreads ();
        ThreadPool::globalThreadPool ().setNumThreads (4);

        testCompressionTypeChecks ();

        const Box2i largeDataWindow (
            V2i (large::minX, large::minY),
            V2i (
                large::minX + large::width - 1,
                large::minY + large::height - 1));
        const Box2i largeDisplayWindow (
            V2i (0, 0),
            V2i (
                large::minX + large::width * 2,
                large::minY + large::height * 2));

        readWriteTest (tempDir, 1, 3, largeDataWindow, largeDisplayWindow);

        const Box2i dataWindow (
            V2i (small::minX, small::minY),
            V2i (
                small::minX + small::width - 1,
                small::minY + small::height - 1));
        const Box2i displayWindow (
            V2i (0, 0),
            V2i (
                small::minX + small::width * 2,
                small::minY + small::height * 2));

        readWriteTest (tempDir, 1, 50, dataWindow, displayWindow);
        readWriteTest (tempDir, 3, 25, dataWindow, displayWindow);
        readWriteTest (tempDir, 10, 10, dataWindow, displayWindow);

        ThreadPool::globalThreadPool ().setNumThreads (numThreads);

        cout << "ok\n" << endl;
    }
    catch (const std::exception& e)
    {
        cerr << "ERROR -- caught exception: " << e.what () << endl;
        assert (false);
    }
}